

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_CutCheckMffc_rec(Jf_Man_t *p,int *pCut,int Limit)

{
  uint i_00;
  int iVar1;
  int *piVar2;
  int i;
  uint i_01;
  bool bVar3;
  
  i_01 = 1;
  while( true ) {
    if (((*pCut & 0xfU) < i_01) || (i_00 = Jf_CutVar(pCut,i_01), i_00 == 0)) {
      return 1;
    }
    piVar2 = p->pGia->pRefs + i_00;
    *piVar2 = *piVar2 + -1;
    bVar3 = false;
    if (*piVar2 == 0) {
      piVar2 = Jf_ObjCuts(p,i_00);
      iVar1 = Jf_CutIsTriv(piVar2 + 1,i_00);
      bVar3 = iVar1 == 0;
    }
    Vec_IntPush(p->vTemp,i_00);
    if (Limit <= p->vTemp->nSize) break;
    if (bVar3) {
      piVar2 = Jf_ObjCuts(p,i_00);
      iVar1 = Jf_CutCheckMffc_rec(p,piVar2 + 1,Limit);
      if (iVar1 == 0) {
        return 0;
      }
    }
    i_01 = i_01 + 1;
  }
  return 0;
}

Assistant:

int Jf_CutCheckMffc_rec( Jf_Man_t * p, int * pCut, int Limit )
{
    int i, Var;
    Jf_CutForEachVar( pCut, Var, i )
    {
        int fRecur = (!Gia_ObjRefDecId(p->pGia, Var) && !Jf_CutIsTriv(Jf_ObjCutBest(p, Var), Var));
        Vec_IntPush( p->vTemp, Var );
        if ( Vec_IntSize(p->vTemp) >= Limit )
            return 0;
        if ( fRecur && !Jf_CutCheckMffc_rec( p, Jf_ObjCutBest(p, Var), Limit ) )
            return 0;
    }
    return 1;
}